

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O0

void ex_random(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  float fVar1;
  long lVar2;
  int iVar3;
  t_float *ptVar4;
  ex_ex *peVar5;
  int local_58;
  int j;
  t_float scalar;
  t_float *rp;
  t_float *lp;
  t_float *op;
  ex_ex *right;
  ex_ex *left;
  ex_ex *optr_local;
  ex_ex *argv_local;
  long argc_local;
  t_expr *e_local;
  
  peVar5 = argv + 1;
  switch(argv->ex_type) {
  case 1:
    switch(argv[1].ex_type) {
    case 1:
      if (optr->ex_type == 0xf) {
        lp = (optr->ex_cont).v_vec;
        iVar3 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)(peVar5->ex_cont).v_flt);
        local_58 = e->exp_vsize;
        while (local_58 != 0) {
          *lp = (float)iVar3;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 1;
        iVar3 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)(peVar5->ex_cont).v_flt);
        optr->ex_cont = (anon_union_8_5_735de1bb_for_ex_cont)(long)iVar3;
      }
      break;
    case 2:
      if (optr->ex_type == 0xf) {
        lp = (optr->ex_cont).v_vec;
        iVar3 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)(peVar5->ex_cont).v_flt);
        local_58 = e->exp_vsize;
        while (local_58 != 0) {
          *lp = (float)iVar3;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 2;
        iVar3 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)(peVar5->ex_cont).v_flt);
        (optr->ex_cont).v_flt = (float)iVar3;
      }
      break;
    case 7:
    default:
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x3da,argv[1].ex_type);
      break;
    case 0xe:
    case 0xf:
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) {
          post("expr~: Int. error %d",0x3da);
          abort();
        }
        optr->ex_type = 0xf;
        ptVar4 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar4;
      }
      lVar2 = (argv->ex_cont).v_int;
      _j = (peVar5->ex_cont).v_vec;
      local_58 = e->exp_vsize;
      lp = (optr->ex_cont).v_vec;
      while (local_58 != 0) {
        iVar3 = ex_dorandom((int)(float)lVar2,(int)*_j);
        *lp = (float)iVar3;
        _j = _j + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
    }
    break;
  case 2:
    switch(argv[1].ex_type) {
    case 1:
      if (optr->ex_type == 0xf) {
        lp = (optr->ex_cont).v_vec;
        iVar3 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)(peVar5->ex_cont).v_flt);
        local_58 = e->exp_vsize;
        while (local_58 != 0) {
          *lp = (float)iVar3;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 2;
        iVar3 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)(peVar5->ex_cont).v_flt);
        (optr->ex_cont).v_flt = (float)iVar3;
      }
      break;
    case 2:
      if (optr->ex_type == 0xf) {
        lp = (optr->ex_cont).v_vec;
        iVar3 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)(peVar5->ex_cont).v_flt);
        local_58 = e->exp_vsize;
        while (local_58 != 0) {
          *lp = (float)iVar3;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 2;
        iVar3 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)(peVar5->ex_cont).v_flt);
        (optr->ex_cont).v_flt = (float)iVar3;
      }
      break;
    case 7:
    default:
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x3da,argv[1].ex_type);
      break;
    case 0xe:
    case 0xf:
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) {
          post("expr~: Int. error %d",0x3da);
          abort();
        }
        optr->ex_type = 0xf;
        ptVar4 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar4;
      }
      fVar1 = (argv->ex_cont).v_flt;
      _j = (peVar5->ex_cont).v_vec;
      local_58 = e->exp_vsize;
      lp = (optr->ex_cont).v_vec;
      while (local_58 != 0) {
        iVar3 = ex_dorandom((int)fVar1,(int)*_j);
        *lp = (float)iVar3;
        _j = _j + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
    }
    break;
  case 7:
  default:
    pd_error(e,"expr: FUNC_EVAL(%d): bad left type %ld\n",0x3da,argv->ex_type);
    break;
  case 0xe:
  case 0xf:
    if (optr->ex_type != 0xf) {
      if (optr->ex_type == 0xe) {
        post("expr~: Int. error %d",0x3da);
        abort();
      }
      optr->ex_type = 0xf;
      ptVar4 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar4;
    }
    lp = (optr->ex_cont).v_vec;
    rp = (argv->ex_cont).v_vec;
    switch(argv[1].ex_type) {
    case 1:
      lVar2 = (peVar5->ex_cont).v_int;
      local_58 = e->exp_vsize;
      while (local_58 != 0) {
        iVar3 = ex_dorandom((int)*rp,(int)(float)lVar2);
        *lp = (float)iVar3;
        rp = rp + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
      break;
    case 2:
      fVar1 = (peVar5->ex_cont).v_flt;
      local_58 = e->exp_vsize;
      while (local_58 != 0) {
        iVar3 = ex_dorandom((int)*rp,(int)fVar1);
        *lp = (float)iVar3;
        rp = rp + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
      break;
    case 7:
    default:
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x3da,argv[1].ex_type);
      break;
    case 0xe:
    case 0xf:
      _j = (peVar5->ex_cont).v_vec;
      local_58 = e->exp_vsize;
      while (local_58 != 0) {
        iVar3 = ex_dorandom((int)*rp,(int)*_j);
        *lp = (float)iVar3;
        _j = _j + 1;
        rp = rp + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
    }
  }
  return;
}

Assistant:

static void
ex_random(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left, *right;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        right = argv;
        FUNC_EVAL(left, right, ex_dorandom, (int), (int), optr, 0);
}